

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhaseObserver.cpp
# Opt level: O0

void __thiscall PhaseObserver::update(PhaseObserver *this)

{
  Phase PVar1;
  ostream *poVar2;
  string *psVar3;
  Player *local_90;
  Player *local_78;
  Player *local_60;
  Player *local_48;
  Player *local_38;
  Phase currentPhase;
  PhaseObserver *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"It is ");
  if (this->concreteSubject == (Subject *)0x0) {
    local_38 = (Player *)0x0;
  }
  else {
    local_38 = (Player *)
               __dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Player::typeinfo,0);
  }
  psVar3 = Player::getPlayerName_abi_cxx11_(local_38);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2,"\'s turn");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if (this->concreteSubject == (Subject *)0x0) {
    local_48 = (Player *)0x0;
  }
  else {
    local_48 = (Player *)
               __dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Player::typeinfo,0);
  }
  PVar1 = Player::getPhase(local_48);
  if (PVar1 == Move) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "---------------------------------------------------------------------------------------"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"| PHASE: ");
    if (this->concreteSubject == (Subject *)0x0) {
      local_60 = (Player *)0x0;
    }
    else {
      local_60 = (Player *)
                 __dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Player::typeinfo,0);
    }
    psVar3 = Player::getPlayerName_abi_cxx11_(local_60);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2," is rolling. |");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "---------------------------------------------------------------------------------------"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  else if (PVar1 == Buy) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "--------------------------------------------------------------------------------------------"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"| PHASE: ");
    if (this->concreteSubject == (Subject *)0x0) {
      local_78 = (Player *)0x0;
    }
    else {
      local_78 = (Player *)
                 __dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Player::typeinfo,0);
    }
    psVar3 = Player::getPlayerName_abi_cxx11_(local_78);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2," is buying cards. |");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "--------------------------------------------------------------------------------------------"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  else if (PVar1 == Roll) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"-----------------------------------");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"| PHASE: ");
    if (this->concreteSubject == (Subject *)0x0) {
      local_90 = (Player *)0x0;
    }
    else {
      local_90 = (Player *)
                 __dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Player::typeinfo,0);
    }
    psVar3 = Player::getPlayerName_abi_cxx11_(local_90);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2," is rolling. |");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"-----------------------------------");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void PhaseObserver::update() {
    cout << "It is " << dynamic_cast<Player *>(concreteSubject)->getPlayerName() << "'s turn" << endl;

    Player::Phase currentPhase = (dynamic_cast<Player *>(concreteSubject)->getPhase());

    if (currentPhase == Player::Phase::Move) {
        cout << endl;
        cout << "---------------------------------------------------------------------------------------" << endl;
        cout << "| PHASE: " << dynamic_cast<Player*>(concreteSubject)->getPlayerName() << " is rolling. |" << endl;
        cout << "---------------------------------------------------------------------------------------" << endl;
        cout << endl;
    } else if (currentPhase == Player::Phase::Buy) {
        cout << endl;
        cout << "--------------------------------------------------------------------------------------------" << endl;
        cout << "| PHASE: " << dynamic_cast<Player*>(concreteSubject)->getPlayerName() << " is buying cards. |" << endl;
        cout << "--------------------------------------------------------------------------------------------" << endl;
        cout << endl;
    } else if (currentPhase == Player::Phase::Roll){
        cout << endl;
        cout << "-----------------------------------" << endl;
        cout << "| PHASE: " << dynamic_cast<Player*>(concreteSubject)->getPlayerName() << " is rolling. |" << endl;
        cout << "-----------------------------------" << endl;
        cout << endl;


    }

}